

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_strategy ZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_matchState_t *pZVar5;
  ZSTD_sequenceProducer_F p_Var6;
  size_t __n;
  size_t sVar7;
  ulong inSeqsSize;
  uint uVar8;
  U32 *rep;
  ZSTD_Sequence *pZVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint *puVar13;
  rawSeqStore_t *rawSeqStore;
  ZSTD_paramSwitch_e useRowMatchFinder;
  ulong uVar14;
  ZSTD_blockCompressor *pp_Var15;
  BYTE *istart;
  ZSTD_sequencePosition seqPos;
  rawSeqStore_t local_58;
  
  if (srcSize < 7) {
    if ((int)(zc->appliedParams).cParams.strategy < 7) {
      ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore,srcSize);
    }
    return 1;
  }
  (zc->seqStore).lit = (zc->seqStore).litStart;
  (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
  (zc->seqStore).longLengthType = ZSTD_llt_none;
  pZVar4 = (zc->blockState).prevCBlock;
  (zc->blockState).matchState.opt.symbolCosts = &pZVar4->entropy;
  (zc->blockState).matchState.opt.literalCompressionMode =
       (zc->appliedParams).literalCompressionMode;
  uVar8 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
  UVar2 = (zc->blockState).matchState.nextToUpdate;
  if (UVar2 + 0x180 < uVar8) {
    uVar12 = (uVar8 - UVar2) - 0x180;
    if (0xbf < uVar12) {
      uVar12 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar8 - uVar12;
  }
  lVar11 = 1;
  if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit) {
    pZVar5 = (zc->blockState).matchState.dictMatchState;
    if (pZVar5 == (ZSTD_matchState_t *)0x0) {
      lVar11 = 0;
    }
    else {
      lVar11 = 3 - (ulong)(pZVar5->dedicatedDictSearch == 0);
    }
  }
  pZVar5 = &(zc->blockState).matchState;
  rep = ((zc->blockState).nextCBlock)->rep;
  lVar10 = 0;
  do {
    rep[lVar10] = pZVar4->rep[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    if ((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0) {
      return 0xffffffffffffffd7;
    }
    rawSeqStore = &zc->externSeqStore;
    useRowMatchFinder = (zc->appliedParams).useRowMatchFinder;
  }
  else {
    if ((zc->appliedParams).ldmParams.enableLdm != ZSTD_ps_enable) {
      p_Var6 = (zc->appliedParams).extSeqProdFunc;
      if (p_Var6 == (ZSTD_sequenceProducer_F)0x0) {
        ZVar3 = (zc->appliedParams).cParams.strategy;
        uVar8 = ZVar3 - ZSTD_greedy;
        pp_Var15 = ZSTD_selectBlockCompressor::rowBasedBlockCompressors[lVar11] + uVar8;
        if ((zc->appliedParams).useRowMatchFinder != ZSTD_ps_enable) {
          pp_Var15 = ZSTD_selectBlockCompressor::blockCompressor[lVar11] + (int)ZVar3;
        }
        if (2 < uVar8) {
          pp_Var15 = ZSTD_selectBlockCompressor::blockCompressor[lVar11] + (int)ZVar3;
        }
        (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
      }
      else {
        inSeqsSize = (*p_Var6)((zc->appliedParams).extSeqProdState,zc->extSeqBuf,
                               zc->extSeqBufCapacity,src,srcSize,(void *)0x0,0,
                               (zc->appliedParams).compressionLevel,
                               1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f));
        uVar14 = 0xffffffffffffff96;
        if (inSeqsSize - 1 < zc->extSeqBufCapacity) {
          pZVar9 = zc->extSeqBuf;
          if (pZVar9[inSeqsSize - 1].matchLength != 0 || pZVar9[inSeqsSize - 1].offset != 0) {
            if (inSeqsSize == zc->extSeqBufCapacity) goto LAB_018bbeff;
            pZVar9 = pZVar9 + inSeqsSize;
            pZVar9->offset = 0;
            pZVar9->litLength = 0;
            pZVar9->matchLength = 0;
            pZVar9->rep = 0;
            inSeqsSize = inSeqsSize + 1;
          }
          uVar14 = inSeqsSize;
          if (inSeqsSize < 0xffffffffffffff89) {
            local_58.seq = (rawSeq *)0x0;
            local_58.pos = 0;
            if (inSeqsSize != 0) {
              puVar13 = &zc->extSeqBuf->matchLength;
              lVar11 = 0;
              lVar10 = 0;
              do {
                lVar11 = lVar11 + (ulong)puVar13[-1];
                lVar10 = lVar10 + (ulong)*puVar13;
                puVar13 = puVar13 + 4;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
              if (srcSize < (ulong)(lVar10 + lVar11)) {
                return 0xffffffffffffff95;
              }
            }
            sVar7 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                              (zc,(ZSTD_sequencePosition *)&local_58,zc->extSeqBuf,inSeqsSize,src,
                               srcSize,(zc->appliedParams).searchForExternalRepcodes);
            if (sVar7 < 0xffffffffffffff89) {
              (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
              return 0;
            }
            return sVar7;
          }
        }
LAB_018bbeff:
        if ((zc->appliedParams).enableMatchFinderFallback == 0) {
          return uVar14;
        }
        ZVar3 = (zc->appliedParams).cParams.strategy;
        uVar8 = ZVar3 - ZSTD_greedy;
        pp_Var15 = ZSTD_selectBlockCompressor::rowBasedBlockCompressors[lVar11] + uVar8;
        if ((zc->appliedParams).useRowMatchFinder != ZSTD_ps_enable) {
          pp_Var15 = ZSTD_selectBlockCompressor::blockCompressor[lVar11] + (int)ZVar3;
        }
        if (2 < uVar8) {
          pp_Var15 = ZSTD_selectBlockCompressor::blockCompressor[lVar11] + (int)ZVar3;
        }
        (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
        rep = ((zc->blockState).nextCBlock)->rep;
      }
      __n = (**pp_Var15)(pZVar5,&zc->seqStore,rep,src,srcSize);
      goto LAB_018bbf7f;
    }
    local_58.pos = 0;
    local_58.posInSequence = 0;
    local_58.size = 0;
    if ((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0) {
      return 0xffffffffffffffd7;
    }
    local_58.seq = zc->ldmSequences;
    local_58.capacity = zc->maxNbLdmSequences;
    sVar7 = ZSTD_ldm_generateSequences
                      (&zc->ldmState,&local_58,&(zc->appliedParams).ldmParams,src,srcSize);
    if (0xffffffffffffff88 < sVar7) {
      return sVar7;
    }
    rep = ((zc->blockState).nextCBlock)->rep;
    useRowMatchFinder = (zc->appliedParams).useRowMatchFinder;
    rawSeqStore = &local_58;
  }
  __n = ZSTD_ldm_blockCompress(rawSeqStore,pZVar5,&zc->seqStore,rep,useRowMatchFinder,src,srcSize);
LAB_018bbf7f:
  switchD_012bc561::default((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
  ppBVar1 = &(zc->seqStore).lit;
  *ppBVar1 = *ppBVar1 + __n;
  return 0;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
     * additional 1. We need to revisit and change this logic to be more consistent */
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable);

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                ZSTD_hasExtSeqProd(&zc->appliedParams),
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                ZSTD_hasExtSeqProd(&zc->appliedParams),
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else if (ZSTD_hasExtSeqProd(&zc->appliedParams)) {
            assert(
                zc->extSeqBufCapacity >= ZSTD_sequenceBound(srcSize)
            );
            assert(zc->appliedParams.extSeqProdFunc != NULL);

            {   U32 const windowSize = (U32)1 << zc->appliedParams.cParams.windowLog;

                size_t const nbExternalSeqs = (zc->appliedParams.extSeqProdFunc)(
                    zc->appliedParams.extSeqProdState,
                    zc->extSeqBuf,
                    zc->extSeqBufCapacity,
                    src, srcSize,
                    NULL, 0,  /* dict and dictSize, currently not supported */
                    zc->appliedParams.compressionLevel,
                    windowSize
                );

                size_t const nbPostProcessedSeqs = ZSTD_postProcessSequenceProducerResult(
                    zc->extSeqBuf,
                    nbExternalSeqs,
                    zc->extSeqBufCapacity,
                    srcSize
                );

                /* Return early if there is no error, since we don't need to worry about last literals */
                if (!ZSTD_isError(nbPostProcessedSeqs)) {
                    ZSTD_sequencePosition seqPos = {0,0,0};
                    size_t const seqLenSum = ZSTD_fastSequenceLengthSum(zc->extSeqBuf, nbPostProcessedSeqs);
                    RETURN_ERROR_IF(seqLenSum > srcSize, externalSequences_invalid, "External sequences imply too large a block!");
                    FORWARD_IF_ERROR(
                        ZSTD_copySequencesToSeqStoreExplicitBlockDelim(
                            zc, &seqPos,
                            zc->extSeqBuf, nbPostProcessedSeqs,
                            src, srcSize,
                            zc->appliedParams.searchForExternalRepcodes
                        ),
                        "Failed to copy external sequences to seqStore!"
                    );
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(5, "Copied %lu sequences from external sequence producer to internal seqStore.", (unsigned long)nbExternalSeqs);
                    return ZSTDbss_compress;
                }

                /* Propagate the error if fallback is disabled */
                if (!zc->appliedParams.enableMatchFinderFallback) {
                    return nbPostProcessedSeqs;
                }

                /* Fallback to software matchfinder */
                {   ZSTD_blockCompressor const blockCompressor =
                        ZSTD_selectBlockCompressor(
                            zc->appliedParams.cParams.strategy,
                            zc->appliedParams.useRowMatchFinder,
                            dictMode);
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(
                        5,
                        "External sequence producer returned error code %lu. Falling back to internal parser.",
                        (unsigned long)nbExternalSeqs
                    );
                    lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
            }   }
        } else {   /* not long range mode and no external matchfinder */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(
                    zc->appliedParams.cParams.strategy,
                    zc->appliedParams.useRowMatchFinder,
                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}